

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O2

ItemFlags __thiscall
QConcatenateTablesProxyModel::flags(QConcatenateTablesProxyModel *this,QModelIndex *index)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  QFlagsStorage<Qt::ItemFlag> QVar4;
  QFlagsStorageHelper<Qt::ItemFlag,_4> QVar5;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if (*(long *)(lVar1 + 0xe8) == 0) {
    QVar4.i = 0;
  }
  else {
    bVar3 = QModelIndex::isValid(index);
    if (!bVar3) {
      plVar2 = (long *)**(undefined8 **)(lVar1 + 0xe0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QVar5.super_QFlagsStorage<Qt::ItemFlag>.i =
             (QFlagsStorage<Qt::ItemFlag>)(**(code **)(*plVar2 + 0x138))(plVar2,index);
        return (QFlagsStorageHelper<Qt::ItemFlag,_4>)
               (QFlagsStorageHelper<Qt::ItemFlag,_4>)QVar5.super_QFlagsStorage<Qt::ItemFlag>.i;
      }
      goto LAB_0041106d;
    }
    local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    mapToSource((QModelIndex *)&local_38,this,index);
    QVar4.i = (*((local_28.ptr)->super_QObject)._vptr_QObject[0x27])(local_28.ptr,&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QFlagsStorageHelper<Qt::ItemFlag,_4>)(QFlagsStorageHelper<Qt::ItemFlag,_4>)QVar4.i;
  }
LAB_0041106d:
  __stack_chk_fail();
}

Assistant:

Qt::ItemFlags QConcatenateTablesProxyModel::flags(const QModelIndex &index) const
{
    Q_D(const QConcatenateTablesProxyModel);
    if (d->m_models.isEmpty())
        return Qt::NoItemFlags;
    Q_ASSERT(checkIndex(index));
    if (!index.isValid())
        return d->m_models.at(0).model->flags(index);
    const QModelIndex sourceIndex = mapToSource(index);
    Q_ASSERT(sourceIndex.isValid());
    return sourceIndex.model()->flags(sourceIndex);
}